

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O1

int AF_AActor_A_MonsterRefire
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int pos;
  AActor *self;
  PClass *pPVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  PClass *pPVar5;
  undefined4 extraout_var_00;
  FState *val;
  AActor *pAVar6;
  char *pcVar7;
  bool bVar8;
  bool bVar9;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar7 = "(paramnum) < numparam";
LAB_003d8796:
    __assert_fail(pcVar7,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x123a,
                  "int AF_AActor_A_MonsterRefire(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (((param->field_0).field_3.Type != '\x03') ||
     (((param->field_0).field_1.atag != 1 && ((param->field_0).field_1.a != (void *)0x0)))) {
    pcVar7 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
    goto LAB_003d8796;
  }
  self = (AActor *)(param->field_0).field_1.a;
  if (self != (AActor *)0x0) {
    if ((self->super_DThinker).super_DObject.Class == (PClass *)0x0) {
      iVar2 = (**(self->super_DThinker).super_DObject._vptr_DObject)(self);
      (self->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar2);
    }
    pPVar5 = (self->super_DThinker).super_DObject.Class;
    bVar8 = pPVar5 == (PClass *)0x0;
    bVar9 = !bVar8;
    defaultparam = (TArray<VMValue,_VMValue> *)
                   CONCAT71((int7)((ulong)defaultparam >> 8),pPVar5 == pPVar1 || bVar8);
    if (pPVar5 != pPVar1 && !bVar8) {
      do {
        pPVar5 = pPVar5->ParentClass;
        bVar9 = pPVar5 != (PClass *)0x0;
        if (pPVar5 == pPVar1) break;
      } while (pPVar5 != (PClass *)0x0);
    }
    if (!bVar9) {
      pcVar7 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003d8796;
    }
  }
  if (numparam == 1) {
    pcVar7 = "(paramnum) < numparam";
LAB_003d874f:
    __assert_fail(pcVar7,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x123b,
                  "int AF_AActor_A_MonsterRefire(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[1].field_0.field_3.Type != '\0') {
    pcVar7 = "param[paramnum].Type == REGT_INT";
    goto LAB_003d874f;
  }
  if (numparam < 3) {
    pcVar7 = "(paramnum) < numparam";
LAB_003d8777:
    __assert_fail(pcVar7,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x123c,
                  "int AF_AActor_A_MonsterRefire(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[2].field_0.field_3.Type != '\0') {
    pcVar7 = "param[paramnum].Type == REGT_INT";
    goto LAB_003d8777;
  }
  iVar2 = param[1].field_0.i;
  pos = param[2].field_0.i;
  if ((self->super_DThinker).super_DObject.Class == (PClass *)0x0) {
    iVar3 = (**(self->super_DThinker).super_DObject._vptr_DObject)(self,defaultparam);
    (self->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var_00,iVar3);
  }
  val = FStateLabelStorage::GetState
                  (&StateLabels,pos,(PClassActor *)(self->super_DThinker).super_DObject.Class,false)
  ;
  A_FaceTarget(self);
  uVar4 = FRandom::GenRand32(&pr_monsterrefire);
  if ((int)(uVar4 & 0xff) < iVar2) {
    if (numret < 1) {
      return 0;
    }
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1242,
                    "int AF_AActor_A_MonsterRefire(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
LAB_003d8659:
    val = (FState *)0x0;
LAB_003d8703:
    VMReturn::SetPointer(ret,val,0);
    iVar2 = 1;
  }
  else {
    pAVar6 = (self->target).field_0.p;
    if (pAVar6 == (AActor *)0x0) {
LAB_003d86f6:
      if (0 < numret) {
        if (ret == (VMReturn *)0x0) {
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x1249,
                        "int AF_AActor_A_MonsterRefire(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        goto LAB_003d8703;
      }
    }
    else {
      if (((pAVar6->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
        (self->target).field_0.p = (AActor *)0x0;
        goto LAB_003d86f6;
      }
      bVar9 = P_HitFriend(self);
      if ((bVar9) || (((self->target).field_0.p)->health < 1)) goto LAB_003d86f6;
      pAVar6 = (self->target).field_0.p;
      if ((pAVar6 != (AActor *)0x0) &&
         (((pAVar6->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
        (self->target).field_0.p = (AActor *)0x0;
        pAVar6 = (AActor *)0x0;
      }
      bVar9 = P_CheckSight(self,pAVar6,6);
      if (!bVar9) goto LAB_003d86f6;
      if (0 < numret) {
        if (ret == (VMReturn *)0x0) {
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x124b,
                        "int AF_AActor_A_MonsterRefire(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        goto LAB_003d8659;
      }
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_MonsterRefire)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT	(prob);
	PARAM_STATE	(jump);

	A_FaceTarget(self);

	if (pr_monsterrefire() < prob)
	{
		ACTION_RETURN_STATE(NULL);
	}
	if (self->target == NULL
		|| P_HitFriend (self)
		|| self->target->health <= 0
		|| !P_CheckSight (self, self->target, SF_SEEPASTBLOCKEVERYTHING|SF_SEEPASTSHOOTABLELINES) )
	{
		ACTION_RETURN_STATE(jump);
	}
	ACTION_RETURN_STATE(NULL);
}